

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscClass.c
# Opt level: O3

int Ssc_GiaSimClassRefineOne(Gia_Man_t *p,int i)

{
  Vec_Int_t **ppVVar1;
  Vec_Int_t **ppVVar2;
  word *pwVar3;
  uint uVar4;
  Vec_Int_t *p_00;
  word *pwVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  Vec_Int_t **ppVVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  
  lVar13 = (long)i;
  if ((~(uint)p->pReprs[lVar13] & 0xfffffff) == 0) {
    ppVVar1 = &p->vClassOld;
    ppVVar2 = &p->vClassNew;
    iVar14 = 0;
    do {
      if (p->pNexts[lVar13] < 1) break;
      p_00 = *ppVVar1;
      p_00->nSize = 0;
      (*ppVVar2)->nSize = 0;
      Vec_IntPush(p_00,i);
      if ((i < 0) || (p->nObjs <= i)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (((~(uint)p->pReprs[lVar13] & 0xfffffff) != 0) || (iVar12 = p->pNexts[lVar13], iVar12 < 1))
      {
        __assert_fail("Gia_ObjIsHead(p, i)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscClass.c"
                      ,0xce,"int Ssc_GiaSimClassRefineOne(Gia_Man_t *, int)");
      }
      do {
        uVar6 = (long)p->vSimsPi->nSize / (long)(p->vCis->nSize - p->nRegs);
        iVar7 = (int)uVar6;
        uVar8 = iVar7 * i;
        if ((int)uVar8 < 0) {
LAB_005bc34c:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                        ,0x19d,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        uVar4 = p->vSims->nSize;
        if ((((int)uVar4 <= (int)uVar8) || (uVar9 = iVar7 * iVar12, (int)uVar9 < 0)) ||
           (uVar4 <= uVar9)) goto LAB_005bc34c;
        pwVar5 = p->vSims->pArray;
        pwVar3 = pwVar5 + uVar8;
        pwVar5 = pwVar5 + uVar9;
        ppVVar11 = ppVVar1;
        if ((((uint)*pwVar5 ^ (uint)*pwVar3) & 1) == 0) {
          if (0 < iVar7) {
            uVar10 = 0;
            do {
              ppVVar11 = ppVVar2;
              if (pwVar3[uVar10] != pwVar5[uVar10]) break;
              uVar10 = uVar10 + 1;
              ppVVar11 = ppVVar1;
            } while ((uVar6 & 0xffffffff) != uVar10);
          }
        }
        else if (0 < iVar7) {
          uVar10 = 0;
          do {
            ppVVar11 = ppVVar2;
            if ((pwVar5[uVar10] ^ pwVar3[uVar10]) != 0xffffffffffffffff) break;
            uVar10 = uVar10 + 1;
            ppVVar11 = ppVVar1;
          } while ((uVar6 & 0xffffffff) != uVar10);
        }
        Vec_IntPush(*ppVVar11,iVar12);
        iVar12 = p->pNexts[iVar12];
      } while (iVar12 != 0);
      if ((*ppVVar2)->nSize == 0) {
        iVar12 = 0;
LAB_005bc33a:
        return iVar12 + iVar14;
      }
      Ssc_GiaSimClassCreate(p,p->vClassOld);
      Ssc_GiaSimClassCreate(p,p->vClassNew);
      if (p->vClassNew->nSize < 2) {
        iVar12 = 1;
        goto LAB_005bc33a;
      }
      i = *p->vClassNew->pArray;
      iVar14 = iVar14 + 1;
      lVar13 = (long)i;
    } while ((~(uint)p->pReprs[lVar13] & 0xfffffff) == 0);
  }
  __assert_fail("Gia_ObjIsHead( p, i )",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscClass.c"
                ,0xc9,"int Ssc_GiaSimClassRefineOne(Gia_Man_t *, int)");
}

Assistant:

int Ssc_GiaSimClassRefineOne( Gia_Man_t * p, int i )
{
    Gia_Obj_t * pObj;
    int Ent;
    assert( Gia_ObjIsHead( p, i ) );
    Vec_IntClear( p->vClassOld );
    Vec_IntClear( p->vClassNew );
    Vec_IntPush( p->vClassOld, i );
    pObj = Gia_ManObj(p, i);
    Gia_ClassForEachObj1( p, i, Ent )
    {
        if ( Ssc_GiaSimAreEqual( p, i, Ent ) )
            Vec_IntPush( p->vClassOld, Ent );
        else
            Vec_IntPush( p->vClassNew, Ent );
    }
    if ( Vec_IntSize( p->vClassNew ) == 0 )
        return 0;
    Ssc_GiaSimClassCreate( p, p->vClassOld );
    Ssc_GiaSimClassCreate( p, p->vClassNew );
    if ( Vec_IntSize(p->vClassNew) > 1 )
        return 1 + Ssc_GiaSimClassRefineOne( p, Vec_IntEntry(p->vClassNew,0) );
    return 1;
}